

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O1

void __thiscall chrono::turtlebot::Turtlebot_Part::AddVisualizationAssets(Turtlebot_Part *this)

{
  element_type *peVar1;
  long *plVar2;
  ChTriangleMeshShape *this_00;
  undefined **ppuVar3;
  double *size;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  string vis_mesh_file;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  long *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  ChTriangleMeshShape *local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  long *local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  long *local_128 [2];
  long local_118 [2];
  undefined **local_108;
  long local_100;
  undefined *puStack_f8;
  long local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  ChMatrix33<double> local_c8;
  double local_80;
  double local_78;
  double local_70;
  undefined1 local_68 [32];
  undefined8 uStack_48;
  undefined8 local_28;
  
  std::operator+(&local_148,"robot/turtlebot/",&this->m_mesh_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_148);
  ppuVar3 = (undefined **)(plVar2 + 2);
  if ((undefined **)*plVar2 == ppuVar3) {
    puStack_f8 = *ppuVar3;
    local_f0 = plVar2[3];
    local_108 = &puStack_f8;
  }
  else {
    puStack_f8 = *ppuVar3;
    local_108 = (undefined **)*plVar2;
  }
  local_100 = plVar2[1];
  *plVar2 = (long)ppuVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  chrono::GetChronoDataFile((string *)local_128);
  if (local_108 != &puStack_f8) {
    operator_delete(local_108,(ulong)(puStack_f8 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)&local_178,SUB81(local_128,0),true);
  local_80 = (this->m_offset).m_data[0];
  size = &local_80;
  local_78 = (this->m_offset).m_data[1];
  local_70 = (this->m_offset).m_data[2];
  stack0xffffffffffffffa0 = SUB6456(ZEXT864(0),4);
  local_68._0_8_ = 0x3ff0000000000000;
  _local_68 = ZEXT4064(CONCAT832(0x3ff0000000000000,local_68));
  local_28 = 0x3ff0000000000000;
  (**(code **)(*local_178 + 0x80))();
  this_00 = (ChTriangleMeshShape *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)size);
  chrono::ChTriangleMeshShape::ChTriangleMeshShape(this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
            (&local_180,this_00);
  local_158 = local_178;
  local_150 = local_170;
  if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_170->_M_use_count = local_170->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_170->_M_use_count = local_170->_M_use_count + 1;
    }
  }
  chrono::ChTriangleMeshShape::SetMesh(this_00,&local_158,1);
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  std::__cxx11::string::_M_assign((string *)(this_00 + 0x40));
  this_00[9] = (ChTriangleMeshShape)0x0;
  peVar1 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_160 = local_180._M_pi;
  if (local_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_180._M_pi)->_M_use_count = (local_180._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_180._M_pi)->_M_use_count = (local_180._M_pi)->_M_use_count + 1;
    }
  }
  local_148._M_dataplus._M_p = &DAT_3ff0000000000000;
  local_148._M_string_length = 0;
  local_148.field_2._M_allocated_capacity = 0;
  local_148.field_2._8_8_ = 0;
  local_108 = &PTR__ChFrame_0017db90;
  local_100 = 0;
  puStack_f8 = (undefined *)0x0;
  local_f0 = 0;
  local_e8 = 0x3ff0000000000000;
  local_e0 = 0;
  uStack_d8 = 0;
  local_d0 = 0;
  local_168 = this_00;
  ChMatrix33<double>::ChMatrix33(&local_c8,(ChQuaternion<double> *)&local_148);
  chrono::ChPhysicsItem::AddVisualShape(peVar1,&local_168,&local_108);
  if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
  }
  if (local_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180._M_pi);
  }
  if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
  }
  if (local_128[0] != local_118) {
    operator_delete(local_128[0],local_118[0] + 1);
  }
  return;
}

Assistant:

void Turtlebot_Part::AddVisualizationAssets() {
    auto vis_mesh_file = GetChronoDataFile("robot/turtlebot/" + m_mesh_name + ".obj");
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(vis_mesh_file, true, true);
    trimesh->Transform(m_offset, ChMatrix33<>(1));
    auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
    trimesh_shape->SetMesh(trimesh);
    trimesh_shape->SetName(m_mesh_name);
    trimesh_shape->SetMutable(false);
    m_body->AddVisualShape(trimesh_shape);
    return;
}